

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.h
# Opt level: O0

void __thiscall s2coding::StringVectorEncoder::Add(StringVectorEncoder *this,string *str)

{
  size_t sVar1;
  void *src;
  size_t local_20;
  string *local_18;
  string *str_local;
  StringVectorEncoder *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  local_20 = Encoder::length(&this->data_);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->offsets_,&local_20);
  sVar1 = std::__cxx11::string::size();
  Encoder::Ensure(&this->data_,sVar1);
  src = (void *)std::__cxx11::string::data();
  sVar1 = std::__cxx11::string::size();
  Encoder::putn(&this->data_,src,sVar1);
  return;
}

Assistant:

inline void StringVectorEncoder::Add(const string& str) {
  offsets_.push_back(data_.length());
  data_.Ensure(str.size());
  data_.putn(str.data(), str.size());
}